

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O1

void __thiscall
sglr::GLContext::genRenderbuffers(GLContext *this,int numRenderbuffers,deUint32 *renderbuffers)

{
  long lVar1;
  _Alloc_node __an;
  _Alloc_node local_38;
  
  glu::CallLogWrapper::glGenRenderbuffers(this->m_wrapper,numRenderbuffers,renderbuffers);
  if (0 < numRenderbuffers) {
    lVar1 = (ulong)(uint)numRenderbuffers << 2;
    local_38._M_t = &(this->m_allocatedRbos)._M_t;
    do {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::
      _M_insert_unique_<unsigned_int&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&this->m_allocatedRbos,
                 (const_iterator)&(this->m_allocatedRbos)._M_t._M_impl.super__Rb_tree_header,
                 renderbuffers,&local_38);
      renderbuffers = renderbuffers + 1;
      lVar1 = lVar1 + -4;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void GLContext::genRenderbuffers (int numRenderbuffers, deUint32* renderbuffers)
{
	m_wrapper->glGenRenderbuffers(numRenderbuffers, renderbuffers);
	if (numRenderbuffers > 0)
		m_allocatedRbos.insert(renderbuffers, renderbuffers+numRenderbuffers);
}